

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O0

int AF_DFloor_CreateFloor
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double speed_00;
  EFloor floortype_00;
  int iVar1;
  line_t_conflict *line;
  bool bVar2;
  VMValue *pVVar3;
  sector_t_conflict *local_78;
  bool local_6a;
  bool local_69;
  int u;
  bool hexencrush;
  int iStack_64;
  bool hereticlower;
  int change;
  int crush;
  double height;
  double speed;
  line_t_conflict *ln;
  int floortype;
  sector_t_conflict *sec;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                  ,0x1f2,
                  "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((param->field_0).field_3.Type != '\x03') {
    __assert_fail("param[paramnum].Type == REGT_POINTER",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                  ,0x1f2,
                  "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if ((param->field_0).field_1.a == (void *)0x0) {
    NullParam("\"sec\"");
    local_78 = (sector_t_conflict *)(param->field_0).field_1.a;
  }
  else {
    local_78 = (sector_t_conflict *)(param->field_0).field_1.a;
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                  ,499,
                  "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    __assert_fail("param[paramnum].Type == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                  ,499,
                  "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  floortype_00 = param[1].field_0.i;
  if (2 < numparam) {
    if (param[2].field_0.field_3.Type != '\x03') {
      __assert_fail("param[paramnum].Type == REGT_POINTER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                    ,500,
                    "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
      ;
    }
    line = (line_t_conflict *)param[2].field_0.field_1.a;
    if (3 < numparam) {
      if (param[3].field_0.field_3.Type != '\x01') {
        __assert_fail("param[paramnum].Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                      ,0x1f5,
                      "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      speed_00 = param[3].field_0.f;
      if (numparam < 5) {
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
        if ((pVVar3->field_0).field_3.Type != '\x01') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                        ,0x1f6,
                        "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
        _change = (pVVar3->field_0).f;
      }
      else {
        if (param[4].field_0.field_3.Type != '\x01') {
          __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                        ,0x1f6,
                        "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        _change = param[4].field_0.f;
      }
      if (numparam < 6) {
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
        if ((pVVar3->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                        ,0x1f7,
                        "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,5);
        iStack_64 = (pVVar3->field_0).i;
      }
      else {
        if (param[5].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                        ,0x1f7,
                        "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iStack_64 = param[5].field_0.i;
      }
      if (numparam < 7) {
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
        if ((pVVar3->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                        ,0x1f8,
                        "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,6);
        u = (pVVar3->field_0).i;
      }
      else {
        if (param[6].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                        ,0x1f8,
                        "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        u = param[6].field_0.i;
      }
      if (numparam < 8) {
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
        if ((pVVar3->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                        ,0x1f9,
                        "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,7);
        iVar1 = (pVVar3->field_0).i;
      }
      else {
        if (param[7].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                        ,0x1f9,
                        "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar1 = param[7].field_0.i;
      }
      local_69 = iVar1 != 0;
      if (numparam < 9) {
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
        if ((pVVar3->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                        ,0x1fa,
                        "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar3 = TArray<VMValue,_VMValue>::operator[](defaultparam,8);
        iVar1 = (pVVar3->field_0).i;
      }
      else {
        if (param[8].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                        ,0x1fa,
                        "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar1 = param[8].field_0.i;
      }
      local_6a = iVar1 != 0;
      bVar2 = P_CreateFloor(local_78,floortype_00,line,speed_00,_change,iStack_64,u,local_6a,
                            local_69);
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                        ,0x1fb,
                        "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetInt(ret,(uint)bVar2);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                  ,0x1f5,
                  "int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("(paramnum) < numparam",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_floor.cpp"
                ,500,"int AF_DFloor_CreateFloor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DFloor, CreateFloor)
{
	PARAM_PROLOGUE;
	PARAM_POINTER_NOT_NULL(sec, sector_t);
	PARAM_INT(floortype);
	PARAM_POINTER(ln, line_t);
	PARAM_FLOAT(speed);
	PARAM_FLOAT_DEF(height);
	PARAM_INT_DEF(crush);
	PARAM_INT_DEF(change);
	PARAM_BOOL_DEF(hereticlower);
	PARAM_BOOL_DEF(hexencrush);
	ACTION_RETURN_BOOL(P_CreateFloor(sec, (DFloor::EFloor)floortype, ln, speed, height, crush, change, hexencrush, hereticlower));
}